

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

double __thiscall
gl4cts::EnhancedLayouts::Utils::Shader::InvalidSourceException::log
          (InvalidSourceException *this,double __x)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  Context *in_RSI;
  double extraout_XMM0_Qa;
  char *local_1b0 [3];
  MessageBuilder local_198;
  Context *local_18;
  Context *context_local;
  InvalidSourceException *this_local;
  
  local_18 = in_RSI;
  context_local = (Context *)this;
  this_00 = deqp::Context::getTestContext(in_RSI);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [27])"Failed to compile shader: ");
  local_1b0[0] = (char *)std::__cxx11::string::c_str();
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  LogSource(local_18,&this->m_source,this->m_stage);
  return extraout_XMM0_Qa;
}

Assistant:

void Shader::InvalidSourceException::log(deqp::Context& context) const
{
	context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to compile shader: " << m_message.c_str()
									  << tcu::TestLog::EndMessage;

	LogSource(context, m_source, m_stage);
}